

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O0

void __thiscall
luna::CodeGenerateVisitor::SetTableFieldValue<luna::TableIndexField>
          (CodeGenerateVisitor *this,TableIndexField *field,int table_register,int key_register,
          int line)

{
  int start_register;
  Instruction line_00;
  pointer pSVar1;
  CodeGenerateVisitor *in_RDI;
  Instruction in_R8D;
  CodeGenerateVisitor *unaff_retaddr;
  Instruction instruction;
  ExpVarData_conflict exp_var_data;
  int value_register;
  OpType in_stack_ffffffffffffffd0;
  Function *in_stack_ffffffffffffffd8;
  
  start_register = GenerateRegisterId(unaff_retaddr);
  ExpVarData::ExpVarData((ExpVarData *)&stack0xffffffffffffffd8,start_register,start_register + 1);
  pSVar1 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x1b3620);
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,in_RDI,&stack0xffffffffffffffd8);
  line_00 = Instruction::ABCCode
                      (in_stack_ffffffffffffffd0,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,0);
  GetCurrentFunction(in_RDI);
  Function::AddInstruction(in_stack_ffffffffffffffd8,in_R8D,line_00.opcode_);
  return;
}

Assistant:

void CodeGenerateVisitor::SetTableFieldValue(TableFieldType *field,
                                                 int table_register,
                                                 int key_register,
                                                 int line)
    {
        // Load value
        auto value_register = GenerateRegisterId();
        ExpVarData exp_var_data{ value_register, value_register + 1 };
        field->value_->Accept(this, &exp_var_data);

        // Set table field
        auto instruction = Instruction::ABCCode(OpType_SetTable, table_register,
                                                key_register, value_register);
        GetCurrentFunction()->AddInstruction(instruction, line);
    }